

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void ly_err_clean(int with_errno)

{
  ly_err_item *__ptr;
  ly_err_item *plVar1;
  ly_err *plVar2;
  
  plVar2 = ly_err_location();
  __ptr = plVar2->errlist;
  plVar2 = ly_err_location();
  plVar2->errlist = (ly_err_item *)0x0;
  while (__ptr != (ly_err_item *)0x0) {
    plVar1 = __ptr->next;
    free(__ptr->msg);
    free(__ptr->path);
    free(__ptr);
    __ptr = plVar1;
  }
  if (with_errno != 0) {
    plVar2 = ly_err_location();
    plVar2->no = LY_SUCCESS;
    plVar2 = ly_err_location();
    plVar2->code = LYVE_SUCCESS;
  }
  return;
}

Assistant:

void
ly_err_clean(int with_errno)
{
    struct ly_err_item *i, *next;

    i = ly_err_location()->errlist;
    ly_err_location()->errlist = NULL;
    for (; i; i = next) {
        next = i->next;
        free(i->msg);
        free(i->path);
        free(i);
    }

    if (with_errno) {
        ly_err_location()->no = LY_SUCCESS;
        ly_err_location()->code = LYVE_SUCCESS;
    }
}